

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numpy.h
# Opt level: O0

bool pybind11::array_t<unsigned_char,_16>::check_(handle h)

{
  _func_bool_PyObject_ptr_PyObject_ptr *p_Var1;
  PyObject *pPVar2;
  bool bVar3;
  bool bVar4;
  npy_api *this;
  PyObject **ppPVar5;
  PyArray_Proxy *pPVar6;
  bool local_3d;
  handle local_28;
  npy_api *local_20;
  npy_api *api;
  handle h_local;
  
  api = (npy_api *)h.m_ptr;
  this = detail::npy_api::get();
  local_20 = this;
  ppPVar5 = handle::ptr((handle *)&api);
  bVar4 = detail::npy_api::PyArray_Check_(this,*ppPVar5);
  bVar3 = false;
  local_3d = false;
  if (bVar4) {
    p_Var1 = local_20->PyArray_EquivTypes_;
    ppPVar5 = handle::ptr((handle *)&api);
    pPVar6 = detail::array_proxy(*ppPVar5);
    pPVar2 = pPVar6->descr;
    dtype::of<unsigned_char>();
    bVar3 = true;
    ppPVar5 = handle::ptr(&local_28);
    bVar4 = (*p_Var1)(pPVar2,*ppPVar5);
    local_3d = false;
    if (bVar4) {
      ppPVar5 = handle::ptr((handle *)&api);
      local_3d = detail::check_flags(*ppPVar5,0);
    }
  }
  h_local.m_ptr._7_1_ = local_3d;
  if (bVar3) {
    dtype::~dtype((dtype *)&local_28);
  }
  return (bool)(h_local.m_ptr._7_1_ & 1);
}

Assistant:

static bool check_(handle h) {
        const auto &api = detail::npy_api::get();
        return api.PyArray_Check_(h.ptr())
               && api.PyArray_EquivTypes_(detail::array_proxy(h.ptr())->descr,
                                          dtype::of<T>().ptr())
               && detail::check_flags(h.ptr(), ExtraFlags & (array::c_style | array::f_style));
    }